

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

void mcu8str_reserve(mcu8str *str,mcu8str_size_t nsize)

{
  int iVar1;
  undefined4 uVar2;
  char *pcVar3;
  undefined4 uVar4;
  mcu8str newstr;
  mcu8str local_30;
  
  if ((ulong)str->buflen < nsize + 1) {
    mcu8str_create(&local_30,nsize);
    memcpy(local_30.c_str,str->c_str,(ulong)(str->size + 1));
    pcVar3 = str->c_str;
    iVar1 = str->owns_memory;
    str->c_str = local_30.c_str;
    uVar2 = str->size;
    uVar4 = str->buflen;
    str->buflen = local_30.buflen;
    str->owns_memory = local_30.owns_memory;
    local_30.c_str = pcVar3;
    local_30.size = uVar2;
    local_30.buflen = uVar4;
    local_30.owns_memory = iVar1;
    mcu8str_dealloc(&local_30);
  }
  return;
}

Assistant:

void mcu8str_reserve( mcu8str* str, mcu8str_size_t nsize )
  {
    if ( nsize +1 <= str->buflen )
      return;//already has enough
    mcu8str newstr = mcu8str_create( nsize );
    //newstr.c_str can not overlap since it was just malloc'ed:
    STDNS memcpy( newstr.c_str, str->c_str, str->size + 1 );
    newstr.size = str->size;
    mcu8str_swap( str, &newstr );
    mcu8str_dealloc( &newstr );
  }